

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_check_magic.c
# Opt level: O0

char * write_all_states(char *buff,uint states)

{
  uint s;
  char *__src;
  uint in_ESI;
  char *in_RDI;
  uint lowbit;
  uint local_c;
  
  *in_RDI = '\0';
  local_c = in_ESI;
  while (s = local_c & (local_c ^ 0xffffffff) + 1, s != 0) {
    local_c = (s ^ 0xffffffff) & local_c;
    __src = state_name(s);
    strcat(in_RDI,__src);
    if (local_c != 0) {
      strcat(in_RDI,"/");
    }
  }
  return in_RDI;
}

Assistant:

static char *
write_all_states(char *buff, unsigned int states)
{
	unsigned int lowbit;

	buff[0] = '\0';

	/* A trick for computing the lowest set bit. */
	while ((lowbit = states & (1 + ~states)) != 0) {
		states &= ~lowbit;		/* Clear the low bit. */
		strcat(buff, state_name(lowbit));
		if (states != 0)
			strcat(buff, "/");
	}
	return buff;
}